

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedTimeZone::getOffsetInternal
          (RuleBasedTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt,int32_t *rawOffset,int32_t *dstOffset,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  Transition *pTVar3;
  void *pvVar4;
  UDate UVar5;
  UDate tend;
  int32_t idx;
  UDate tstart;
  TimeZoneRule *rule;
  int32_t *dstOffset_local;
  int32_t *rawOffset_local;
  int32_t DuplicatedTimeOpt_local;
  int32_t NonExistingTimeOpt_local;
  UBool local_local;
  UDate date_local;
  RuleBasedTimeZone *this_local;
  
  *rawOffset = 0;
  *dstOffset = 0;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fUpToDate == '\0') {
      *status = U_INVALID_STATE_ERROR;
    }
    else {
      tstart = 0.0;
      if (this->fHistoricTransitions == (UVector *)0x0) {
        tstart = (UDate)this->fInitialRule;
      }
      else {
        pTVar3 = (Transition *)UVector::elementAt(this->fHistoricTransitions,0);
        UVar5 = getTransitionTime(this,pTVar3,local,NonExistingTimeOpt,DuplicatedTimeOpt);
        if (UVar5 <= date) {
          iVar2 = UVector::size(this->fHistoricTransitions);
          tend._4_4_ = iVar2 + -1;
          pTVar3 = (Transition *)UVector::elementAt(this->fHistoricTransitions,tend._4_4_);
          UVar5 = getTransitionTime(this,pTVar3,local,NonExistingTimeOpt,DuplicatedTimeOpt);
          if (date <= UVar5) {
            for (; -1 < tend._4_4_; tend._4_4_ = tend._4_4_ + -1) {
              pTVar3 = (Transition *)UVector::elementAt(this->fHistoricTransitions,tend._4_4_);
              UVar5 = getTransitionTime(this,pTVar3,local,NonExistingTimeOpt,DuplicatedTimeOpt);
              if (UVar5 <= date) break;
            }
            pvVar4 = UVector::elementAt(this->fHistoricTransitions,tend._4_4_);
            tstart = *(UDate *)((long)pvVar4 + 0x10);
          }
          else {
            if (this->fFinalRules != (UVector *)0x0) {
              tstart = (UDate)findRuleInFinal(this,date,local,NonExistingTimeOpt,DuplicatedTimeOpt);
            }
            if (tstart == 0.0) {
              pvVar4 = UVector::elementAt(this->fHistoricTransitions,tend._4_4_);
              tstart = *(UDate *)((long)pvVar4 + 0x10);
            }
          }
        }
        else {
          tstart = (UDate)this->fInitialRule;
        }
      }
      if (tstart != 0.0) {
        iVar2 = TimeZoneRule::getRawOffset((TimeZoneRule *)tstart);
        *rawOffset = iVar2;
        iVar2 = TimeZoneRule::getDSTSavings((TimeZoneRule *)tstart);
        *dstOffset = iVar2;
      }
    }
  }
  return;
}

Assistant:

void
RuleBasedTimeZone::getOffsetInternal(UDate date, UBool local,
                                     int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt,
                                     int32_t& rawOffset, int32_t& dstOffset,
                                     UErrorCode& status) const {
    rawOffset = 0;
    dstOffset = 0;

    if (U_FAILURE(status)) {
        return;
    }
    if (!fUpToDate) {
        // Transitions are not yet resolved.  We cannot do it here
        // because this method is const.  Thus, do nothing and return
        // error status.
        status = U_INVALID_STATE_ERROR;
        return;
    }
    const TimeZoneRule *rule = NULL;
    if (fHistoricTransitions == NULL) {
        rule = fInitialRule;
    } else {
        UDate tstart = getTransitionTime((Transition*)fHistoricTransitions->elementAt(0),
            local, NonExistingTimeOpt, DuplicatedTimeOpt);
        if (date < tstart) {
            rule = fInitialRule;
        } else {
            int32_t idx = fHistoricTransitions->size() - 1;
            UDate tend = getTransitionTime((Transition*)fHistoricTransitions->elementAt(idx),
                local, NonExistingTimeOpt, DuplicatedTimeOpt);
            if (date > tend) {
                if (fFinalRules != NULL) {
                    rule = findRuleInFinal(date, local, NonExistingTimeOpt, DuplicatedTimeOpt);
                }
                if (rule == NULL) {
                    // no final rules or the given time is before the first transition
                    // specified by the final rules -> use the last rule 
                    rule = ((Transition*)fHistoricTransitions->elementAt(idx))->to;
                }
            } else {
                // Find a historical transition
                while (idx >= 0) {
                    if (date >= getTransitionTime((Transition*)fHistoricTransitions->elementAt(idx),
                        local, NonExistingTimeOpt, DuplicatedTimeOpt)) {
                        break;
                    }
                    idx--;
                }
                rule = ((Transition*)fHistoricTransitions->elementAt(idx))->to;
            }
        }
    }
    if (rule != NULL) {
        rawOffset = rule->getRawOffset();
        dstOffset = rule->getDSTSavings();
    }
}